

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCodeAtInit(Parse *pParse,Expr *pExpr,int regDest)

{
  ExprList_item *pEVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined8 in_RAX;
  ulong uVar6;
  Expr *pExpr_00;
  ExprList *pEVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  anon_union_4_2_6146edf4_for_u *paVar11;
  
  pEVar7 = pParse->pConstExpr;
  uVar6 = CONCAT71((int7)((ulong)in_RAX >> 8),regDest < 0);
  iVar5 = (int)uVar6;
  if (pEVar7 != (ExprList *)0x0 && regDest < 0) {
    iVar8 = pEVar7->nExpr;
    bVar2 = iVar8 < 1;
    if (0 < iVar8) {
      paVar11 = &pEVar7->a->u;
      iVar8 = iVar8 + 1;
      do {
        if ((paVar11->iConstExprReg & 0x40000000000U) != 0) {
          uVar4 = sqlite3ExprCompare(((ExprList_item *)(paVar11 + -7))->pExpr,pExpr,-1);
          uVar6 = (ulong)uVar4;
          if (uVar4 == 0) {
            iVar5 = paVar11->iConstExprReg;
            break;
          }
        }
        iVar5 = (int)uVar6;
        iVar9 = iVar8 + -1;
        paVar11 = paVar11 + 8;
        iVar3 = iVar8 + -3;
        bVar2 = iVar9 < 2;
        iVar8 = iVar9;
      } while (SBORROW4(iVar9,2) == iVar3 < 0);
    }
    if (!bVar2) {
      return iVar5;
    }
  }
  if (pExpr == (Expr *)0x0) {
    pExpr_00 = (Expr *)0x0;
  }
  else {
    pExpr_00 = exprDup(pParse->db,pExpr,0,(u8 **)0x0);
  }
  pEVar7 = sqlite3ExprListAppend(pParse,pEVar7,pExpr_00);
  if (pEVar7 != (ExprList *)0x0) {
    pEVar1 = pEVar7->a;
    lVar10 = (long)pEVar7->nExpr;
    pEVar1[lVar10 + -1].field_0x19 =
         pEVar1[lVar10 + -1].field_0x19 & 0xfb | (byte)((uint)regDest >> 0x1d) & 4;
    if (regDest < 0) {
      regDest = pParse->nMem + 1;
      pParse->nMem = regDest;
    }
    pEVar1[lVar10 + -1].u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = pEVar7;
  return regDest;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeAtInit(
  Parse *pParse,    /* Parsing context */
  Expr *pExpr,      /* The expression to code when the VDBE initializes */
  int regDest       /* Store the value in this register */
){
  ExprList *p;
  assert( ConstFactorOk(pParse) );
  p = pParse->pConstExpr;
  if( regDest<0 && p ){
    struct ExprList_item *pItem;
    int i;
    for(pItem=p->a, i=p->nExpr; i>0; pItem++, i--){
      if( pItem->reusable && sqlite3ExprCompare(pItem->pExpr,pExpr,-1)==0 ){
        return pItem->u.iConstExprReg;
      }
    }
  }
  pExpr = sqlite3ExprDup(pParse->db, pExpr, 0);
  p = sqlite3ExprListAppend(pParse, p, pExpr);
  if( p ){
     struct ExprList_item *pItem = &p->a[p->nExpr-1];
     pItem->reusable = regDest<0;
     if( regDest<0 ) regDest = ++pParse->nMem;
     pItem->u.iConstExprReg = regDest;
  }
  pParse->pConstExpr = p;
  return regDest;
}